

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O3

void __thiscall
Js::AsyncGeneratorCallbackFunction::MarshalCrossSite_TTDInflate
          (AsyncGeneratorCallbackFunction *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::AsyncGeneratorCallbackFunction>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.h"
                                ,0x76,
                                "(VirtualTableInfo<AsyncGeneratorCallbackFunction>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)
       VirtualTableInfo<Js::CrossSiteObject<Js::AsyncGeneratorCallbackFunction>_>::Address;
  return;
}

Assistant:

AsyncGeneratorCallbackFunction(
        DynamicType* type,
        FunctionInfo* functionInfo,
        JavascriptAsyncGenerator* generator) :
            RuntimeFunction(type, functionInfo),
            generator(generator) {}